

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_pending(event *ev,short event,timeval *tv)

{
  ulong uVar1;
  timeval tmp;
  int flags;
  timeval *tv_local;
  short event_local;
  event *ev_local;
  
  tmp.tv_usec._4_4_ = 0;
  if (ev->ev_base == (event_base *)0x0) {
    event_warnx("%s: event has no event_base set.","event_pending");
    ev_local._4_4_ = 0;
  }
  else {
    if (ev->ev_base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,ev->ev_base->th_base_lock);
    }
    event_debug_assert_is_setup_(ev);
    if (((ev->ev_evcallback).evcb_flags & 2U) != 0) {
      tmp.tv_usec._4_4_ = (int)ev->ev_events & 0x8e;
    }
    if (((ev->ev_evcallback).evcb_flags & 0x28U) != 0) {
      tmp.tv_usec._4_4_ = (int)ev->ev_res | tmp.tv_usec._4_4_;
    }
    if (((ev->ev_evcallback).evcb_flags & 1U) != 0) {
      tmp.tv_usec._4_4_ = tmp.tv_usec._4_4_ | 1;
    }
    if ((tv != (timeval *)0x0) && ((tmp.tv_usec._4_4_ & (int)(short)(event & 0x8fU) & 1) != 0)) {
      uVar1 = (ev->ev_timeout).tv_usec;
      tv->tv_sec = (ev->ev_base->tv_clock_diff).tv_sec + (ev->ev_timeout).tv_sec;
      tv->tv_usec = (ev->ev_base->tv_clock_diff).tv_usec + (uVar1 & 0xfffff);
      if (999999 < tv->tv_usec) {
        tv->tv_sec = tv->tv_sec + 1;
        tv->tv_usec = tv->tv_usec + -1000000;
      }
    }
    if (ev->ev_base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,ev->ev_base->th_base_lock);
    }
    ev_local._4_4_ = tmp.tv_usec._4_4_ & (int)(short)(event & 0x8fU);
  }
  return ev_local._4_4_;
}

Assistant:

int
event_pending(const struct event *ev, short event, struct timeval *tv)
{
	int flags = 0;

	if (EVUTIL_FAILURE_CHECK(ev->ev_base == NULL)) {
		event_warnx("%s: event has no event_base set.", __func__);
		return 0;
	}

	EVBASE_ACQUIRE_LOCK(ev->ev_base, th_base_lock);
	event_debug_assert_is_setup_(ev);

	if (ev->ev_flags & EVLIST_INSERTED)
		flags |= (ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED|EV_SIGNAL));
	if (ev->ev_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER))
		flags |= ev->ev_res;
	if (ev->ev_flags & EVLIST_TIMEOUT)
		flags |= EV_TIMEOUT;

	event &= (EV_TIMEOUT|EV_READ|EV_WRITE|EV_CLOSED|EV_SIGNAL);

	/* See if there is a timeout that we should report */
	if (tv != NULL && (flags & event & EV_TIMEOUT)) {
		struct timeval tmp = ev->ev_timeout;
		tmp.tv_usec &= MICROSECONDS_MASK;
		/* correctly remamp to real time */
		evutil_timeradd(&ev->ev_base->tv_clock_diff, &tmp, tv);
	}

	EVBASE_RELEASE_LOCK(ev->ev_base, th_base_lock);

	return (flags & event);
}